

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-icount.h
# Opt level: O2

void gen_tb_start(TCGContext_conflict9 *tcg_ctx,TranslationBlock *tb)

{
  TCGLabel *pTVar1;
  TCGTemp *ts;
  
  pTVar1 = gen_new_label_tricore(tcg_ctx);
  tcg_ctx->exitreq_label = pTVar1;
  ts = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
  tcg_gen_op3_tricore(tcg_ctx,INDEX_op_ld_i32,(TCGArg)ts,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                      0xfffffffffffffff0);
  tcg_gen_brcondi_i32_tricore
            (tcg_ctx,TCG_COND_LT,(TCGv_i32)((long)ts - (long)tcg_ctx),0,tcg_ctx->exitreq_label);
  tcg_temp_free_internal_tricore(tcg_ctx,ts);
  return;
}

Assistant:

static inline void gen_tb_start(TCGContext *tcg_ctx, TranslationBlock *tb)
{
    TCGv_i32 count;

    tcg_ctx->exitreq_label = gen_new_label(tcg_ctx);

    count = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_ld_i32(tcg_ctx, count, tcg_ctx->cpu_env,
                   offsetof(ArchCPU, neg.icount_decr.u32) -
                   offsetof(ArchCPU, env));

    tcg_gen_brcondi_i32(tcg_ctx, TCG_COND_LT, count, 0, tcg_ctx->exitreq_label);

    tcg_temp_free_i32(tcg_ctx, count);
}